

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator.cpp
# Opt level: O2

void __thiscall
Validator_importUnitsUnnamedUnits_Test::Validator_importUnitsUnnamedUnits_Test
          (Validator_importUnitsUnnamedUnits_Test *this)

{
  testing::Test::Test(&this->super_Test);
  *(undefined ***)this = &PTR__Test_0015e740;
  return;
}

Assistant:

TEST(Validator, importUnitsUnnamedUnits)
{
    const std::vector<std::string> expectedIssues = {
        "Imported units '' does not have a valid name attribute. CellML identifiers must contain one or more basic Latin alphabetic characters.",
    };

    libcellml::ValidatorPtr v = libcellml::Validator::create();
    libcellml::ModelPtr m = createImportUnitsModel();

    libcellml::UnitsPtr u = m->units(0);
    u->setName("");

    v->validateModel(m);

    EXPECT_EQ_ISSUES(expectedIssues, v);
}